

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_adds_a_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [16];
  ushort uVar35;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined8 uVar43;
  ushort uVar49;
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar36;
  undefined1 auVar44 [16];
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar16 = *(short *)pfVar1;
  sVar17 = *(short *)((long)pfVar1 + 2);
  sVar18 = *(short *)((long)pfVar1 + 4);
  sVar19 = *(short *)((long)pfVar1 + 6);
  sVar20 = *(short *)((long)pfVar1 + 8);
  sVar21 = *(short *)((long)pfVar1 + 10);
  sVar22 = *(short *)((long)pfVar1 + 0xc);
  sVar23 = *(short *)((long)pfVar1 + 0xe);
  pfVar1 = (env->active_fpu).fpr + wt;
  sVar24 = *(short *)pfVar1;
  sVar25 = *(short *)((long)pfVar1 + 2);
  sVar26 = *(short *)((long)pfVar1 + 4);
  sVar27 = *(short *)((long)pfVar1 + 6);
  sVar28 = *(short *)((long)pfVar1 + 8);
  sVar29 = *(short *)((long)pfVar1 + 10);
  sVar30 = *(short *)((long)pfVar1 + 0xc);
  sVar31 = *(short *)((long)pfVar1 + 0xe);
  sVar2 = -sVar16;
  sVar3 = -sVar17;
  sVar4 = -sVar18;
  sVar5 = -sVar19;
  sVar6 = -sVar20;
  sVar7 = -sVar21;
  sVar8 = -sVar22;
  sVar9 = -sVar23;
  auVar45._0_2_ = (ushort)(sVar2 < sVar16) * sVar16 | (ushort)(sVar2 >= sVar16) * sVar2;
  uVar46 = (ushort)(sVar3 < sVar17) * sVar17 | (ushort)(sVar3 >= sVar17) * sVar3;
  uVar47 = (ushort)(sVar4 < sVar18) * sVar18 | (ushort)(sVar4 >= sVar18) * sVar4;
  uVar48 = (ushort)(sVar5 < sVar19) * sVar19 | (ushort)(sVar5 >= sVar19) * sVar5;
  uVar43 = CONCAT26(uVar48,CONCAT24(uVar47,CONCAT22(uVar46,auVar45._0_2_)));
  uVar49 = (ushort)(sVar6 < sVar20) * sVar20 | (ushort)(sVar6 >= sVar20) * sVar6;
  auVar44._0_10_ = CONCAT28(uVar49,uVar43);
  auVar44._10_2_ = (ushort)(sVar7 < sVar21) * sVar21 | (ushort)(sVar7 >= sVar21) * sVar7;
  auVar44._12_2_ = (ushort)(sVar8 < sVar22) * sVar22 | (ushort)(sVar8 >= sVar22) * sVar8;
  auVar44._14_2_ = (ushort)(sVar9 < sVar23) * sVar23 | (ushort)(sVar9 >= sVar23) * sVar9;
  sVar2 = -sVar24;
  sVar3 = -sVar25;
  sVar4 = -sVar26;
  sVar5 = -sVar27;
  sVar6 = -sVar28;
  sVar7 = -sVar29;
  sVar8 = -sVar30;
  sVar9 = -sVar31;
  uVar35 = (ushort)(sVar2 < sVar24) * sVar24 | (ushort)(sVar2 >= sVar24) * sVar2;
  uVar38 = (ushort)(sVar3 < sVar25) * sVar25 | (ushort)(sVar3 >= sVar25) * sVar3;
  uVar39 = (ushort)(sVar4 < sVar26) * sVar26 | (ushort)(sVar4 >= sVar26) * sVar4;
  uVar40 = (ushort)(sVar5 < sVar27) * sVar27 | (ushort)(sVar5 >= sVar27) * sVar5;
  uVar36 = CONCAT26(uVar40,CONCAT24(uVar39,CONCAT22(uVar38,uVar35)));
  uVar41 = (ushort)(sVar6 < sVar28) * sVar28 | (ushort)(sVar6 >= sVar28) * sVar6;
  auVar55._0_10_ = CONCAT28(uVar41,uVar36);
  auVar55._10_2_ = (ushort)(sVar7 < sVar29) * sVar29 | (ushort)(sVar7 >= sVar29) * sVar7;
  auVar55._12_2_ = (ushort)(sVar8 < sVar30) * sVar30 | (ushort)(sVar8 >= sVar30) * sVar8;
  auVar55._14_2_ = (ushort)(sVar9 < sVar31) * sVar31 | (ushort)(sVar9 >= sVar31) * sVar9;
  auVar50 = auVar44 | auVar55;
  auVar37._0_2_ = uVar35 + auVar45._0_2_;
  auVar37._2_2_ = uVar38 + uVar46;
  auVar37._4_2_ = uVar39 + uVar47;
  auVar37._6_2_ = uVar40 + uVar48;
  auVar37._8_2_ = uVar41 + uVar49;
  auVar37._10_2_ = auVar55._10_2_ + auVar44._10_2_;
  auVar37._12_2_ = auVar55._12_2_ + auVar44._12_2_;
  auVar37._14_2_ = auVar55._14_2_ + auVar44._14_2_;
  auVar10._10_2_ = 0;
  auVar10._0_10_ = auVar44._0_10_;
  auVar10._12_2_ = uVar48;
  auVar12._8_2_ = uVar47;
  auVar12._0_8_ = uVar43;
  auVar12._10_4_ = auVar10._10_4_;
  auVar32._6_8_ = 0;
  auVar32._0_6_ = auVar12._8_6_;
  auVar14._4_2_ = uVar46;
  auVar14._0_4_ = CONCAT22(uVar46,auVar45._0_2_);
  auVar14._6_8_ = SUB148(auVar32 << 0x40,6);
  auVar45._2_2_ = 0;
  auVar45._4_10_ = auVar14._4_10_;
  auVar45._14_2_ = 0;
  auVar42._2_2_ = 0;
  auVar42._0_2_ = uVar49;
  auVar42._4_2_ = auVar44._10_2_;
  auVar42._6_2_ = 0;
  auVar42._8_2_ = auVar44._12_2_;
  auVar42._10_2_ = 0;
  auVar42._12_2_ = auVar44._14_2_;
  auVar42._14_2_ = 0;
  auVar11._10_2_ = 0;
  auVar11._0_10_ = auVar55._0_10_;
  auVar11._12_2_ = uVar40;
  auVar13._8_2_ = uVar39;
  auVar13._0_8_ = uVar36;
  auVar13._10_4_ = auVar11._10_4_;
  auVar33._6_8_ = 0;
  auVar33._0_6_ = auVar13._8_6_;
  auVar15._4_2_ = uVar38;
  auVar15._0_4_ = CONCAT22(uVar38,uVar35);
  auVar15._6_8_ = SUB148(auVar33 << 0x40,6);
  auVar34._0_2_ = -(ushort)(auVar50._0_2_ < 0);
  auVar34._2_2_ = -(ushort)(auVar50._2_2_ < 0);
  auVar34._4_2_ = -(ushort)(auVar50._4_2_ < 0);
  auVar34._6_2_ = -(ushort)(auVar50._6_2_ < 0);
  auVar34._8_2_ = -(ushort)(auVar50._8_2_ < 0);
  auVar34._10_2_ = -(ushort)(auVar50._10_2_ < 0);
  auVar34._12_2_ = -(ushort)(auVar50._12_2_ < 0);
  auVar34._14_2_ = -(ushort)(auVar50._14_2_ < 0);
  auVar53._0_4_ = 0x7fff - (uint)uVar35;
  auVar53._4_4_ = 0x7fff - auVar15._4_4_;
  auVar53._8_4_ = 0x7fff - auVar13._8_4_;
  auVar53._12_4_ = 0x7fff - (auVar11._10_4_ >> 0x10);
  auVar51._0_4_ = 0x7fff - (uint)uVar41;
  auVar51._4_4_ = 0x7fff - (uint)auVar55._10_2_;
  auVar51._8_4_ = 0x7fff - (uint)auVar55._12_2_;
  auVar51._12_4_ = 0x7fff - (uint)auVar55._14_2_;
  auVar42 = auVar42 | _DAT_00d58680;
  auVar51 = auVar51 ^ _DAT_00d58680;
  auVar52._0_4_ = -(uint)(auVar42._0_4_ < auVar51._0_4_);
  auVar52._4_4_ = -(uint)(auVar42._4_4_ < auVar51._4_4_);
  auVar52._8_4_ = -(uint)(auVar42._8_4_ < auVar51._8_4_);
  auVar52._12_4_ = -(uint)(auVar42._12_4_ < auVar51._12_4_);
  auVar45 = auVar45 | _DAT_00d58680;
  auVar53 = auVar53 ^ _DAT_00d58680;
  auVar54._0_4_ = -(uint)(auVar45._0_4_ < auVar53._0_4_);
  auVar54._4_4_ = -(uint)(auVar45._4_4_ < auVar53._4_4_);
  auVar54._8_4_ = -(uint)(auVar45._8_4_ < auVar53._8_4_);
  auVar54._12_4_ = -(uint)(auVar45._12_4_ < auVar53._12_4_);
  auVar55 = packssdw(auVar54,auVar52);
  auVar50._0_2_ = auVar34._0_2_ >> 1;
  auVar50._2_2_ = auVar34._2_2_ >> 1;
  auVar50._4_2_ = auVar34._4_2_ >> 1;
  auVar50._6_2_ = auVar34._6_2_ >> 1;
  auVar50._8_2_ = auVar34._8_2_ >> 1;
  auVar50._10_2_ = auVar34._10_2_ >> 1;
  auVar50._12_2_ = auVar34._12_2_ >> 1;
  auVar50._14_2_ = auVar34._14_2_ >> 1;
  (env->active_fpu).fpr[wd] =
       (fpr_t)(auVar50 | ~auVar34 & (~auVar55 & _DAT_00d83660 | auVar37 & auVar55));
  return;
}

Assistant:

void helper_msa_adds_a_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_adds_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_adds_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_adds_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_adds_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_adds_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_adds_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_adds_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_adds_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}